

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# date_diff.cpp
# Opt level: O3

long __thiscall
duckdb::DateDiffTernaryOperator::
Operation<duckdb::string_t,duckdb::timestamp_t,duckdb::timestamp_t,long>
          (DateDiffTernaryOperator *this,string_t part,timestamp_t startdate,timestamp_t enddate,
          ValidityMask *mask,idx_t idx)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  byte bVar1;
  _Alloc_hider _Var2;
  size_type sVar3;
  bool bVar4;
  DatePartSpecifier DVar5;
  date_t dVar6;
  date_t dVar7;
  int64_t iVar8;
  TemplatedValidityData<unsigned_long> *pTVar9;
  _Head_base<0UL,_unsigned_long_*,_false> _Var10;
  int64_t left;
  NotImplementedException *this_01;
  long lVar11;
  timestamp_t input;
  long lVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  string local_88;
  undefined8 local_60;
  long local_58;
  string local_50;
  
  input.value = part.value._8_8_;
  local_60 = this;
  local_58 = part.value._0_8_;
  bVar4 = Value::IsFinite<duckdb::timestamp_t>(input);
  if ((!bVar4) || (bVar4 = Value::IsFinite<duckdb::timestamp_t>(startdate), !bVar4)) {
    _Var10._M_head_impl = *(unsigned_long **)enddate.value;
    if (_Var10._M_head_impl == (unsigned_long *)0x0) {
      local_50._M_dataplus._M_p = *(pointer *)(enddate.value + 0x18);
      make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                ((duckdb *)&local_88,(unsigned_long *)&local_50);
      sVar3 = local_88._M_string_length;
      _Var2._M_p = local_88._M_dataplus._M_p;
      local_88._M_dataplus._M_p = (pointer)0x0;
      local_88._M_string_length = 0;
      this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(enddate.value + 0x10);
      *(pointer *)(enddate.value + 8) = _Var2._M_p;
      *(size_type *)(enddate.value + 0x10) = sVar3;
      if ((this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
         (::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00),
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length !=
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0)) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_88._M_string_length);
      }
      pTVar9 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                         ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                          (enddate.value + 8));
      _Var10._M_head_impl =
           (pTVar9->owned_data).
           super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
           super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
           super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
           super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
      *(unsigned_long **)enddate.value = _Var10._M_head_impl;
    }
    bVar1 = (byte)mask & 0x3f;
    _Var10._M_head_impl[(ulong)mask >> 6] =
         _Var10._M_head_impl[(ulong)mask >> 6] &
         (-2L << bVar1 | 0xfffffffffffffffeU >> 0x40 - bVar1);
    return 0;
  }
  lVar15 = part.value._0_8_;
  if ((uint)this < 0xd) {
    lVar15 = (long)&local_60 + 4;
  }
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_50,lVar15,((ulong)this & 0xffffffff) + lVar15);
  DVar5 = GetDatePartSpecifier(&local_50);
  if (JULIAN_DAY < DVar5) {
switchD_01afbef2_caseD_12:
    this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_88,"Specifier type not implemented for DATEDIFF","");
    NotImplementedException::NotImplementedException(this_01,&local_88);
    __cxa_throw(this_01,&NotImplementedException::typeinfo,::std::runtime_error::~runtime_error);
  }
  lVar14 = startdate.value >> 0x3f;
  lVar15 = input.value >> 0x3f;
  switch(DVar5) {
  case BEGIN_BIGINT:
    iVar8 = DateDiff::YearOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
                      (input,startdate);
    break;
  case MONTH:
    iVar8 = DateDiff::MonthOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
                      (input,startdate);
    break;
  default:
    iVar8 = DateDiff::DayOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
                      (input,startdate);
    break;
  case DECADE:
    iVar8 = DateDiff::DecadeOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
                      (input,startdate);
    break;
  case CENTURY:
    iVar8 = DateDiff::CenturyOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
                      (input,startdate);
    break;
  case MILLENNIUM:
    iVar8 = DateDiff::MilleniumOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
                      (input,startdate);
    break;
  case MICROSECONDS:
    iVar8 = Timestamp::GetEpochMicroSeconds(input);
    left = Timestamp::GetEpochMicroSeconds(startdate);
    iVar8 = SubtractOperatorOverflowCheck::Operation<long,long,long>(left,iVar8);
    break;
  case MILLISECONDS:
    lVar11 = (startdate.value - lVar14) / 1000;
    lVar12 = SUB168(SEXT816(input.value - lVar15) * SEXT816(-0x20c49ba5e353f7cf),8);
    lVar13 = lVar12 >> 7;
    goto LAB_01afc077;
  case SECOND:
  case BEGIN_DOUBLE:
    lVar11 = (startdate.value - lVar14) / 1000000;
    lVar12 = SUB168(SEXT816(input.value - lVar15) * SEXT816(-0x431bde82d7b634db),8);
    lVar13 = lVar12 >> 0x12;
LAB_01afc077:
    lVar13 = lVar13 - (lVar12 >> 0x3f);
LAB_01afc197:
    iVar8 = (lVar14 - lVar15) + lVar13 + lVar11;
    break;
  case MINUTE:
    lVar11 = (startdate.value - lVar14) / 60000000;
    lVar12 = SUB168(SEXT816(input.value - lVar15) * SEXT816(0x70d59cc6bc5928d7),8) -
             (input.value - lVar15);
    lVar13 = lVar12 >> 0x19;
    goto LAB_01afc191;
  case HOUR:
    lVar11 = (startdate.value - lVar14) / 3600000000;
    lVar12 = SUB168(SEXT816(input.value - lVar15) * SEXT816(0x674a40d3fc1ad63b),8) -
             (input.value - lVar15);
    lVar13 = lVar12 >> 0x1f;
LAB_01afc191:
    lVar13 = lVar13 - (lVar12 >> 0x3f);
    goto LAB_01afc197;
  case WEEK:
  case YEARWEEK:
    dVar6 = Timestamp::GetDate(input);
    dVar7 = Timestamp::GetDate(startdate);
    iVar8 = (int64_t)((dVar7.days - dVar6.days) / 7);
    break;
  case ISOYEAR:
    iVar8 = DateDiff::ISOYearOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
                      (input,startdate);
    break;
  case QUARTER:
    iVar8 = DateDiff::QuarterOperator::Operation<duckdb::timestamp_t,duckdb::timestamp_t,long>
                      (input,startdate);
    break;
  case ERA:
  case TIMEZONE:
  case TIMEZONE_HOUR:
  case TIMEZONE_MINUTE:
    goto switchD_01afbef2_caseD_12;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  return iVar8;
}

Assistant:

static inline TR Operation(TS part, TA startdate, TB enddate, ValidityMask &mask, idx_t idx) {
		if (Value::IsFinite(startdate) && Value::IsFinite(enddate)) {
			return DifferenceDates<TA, TB, TR>(GetDatePartSpecifier(part.GetString()), startdate, enddate);
		} else {
			mask.SetInvalid(idx);
			return TR();
		}
	}